

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::Variable::declare_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  DeclareVariable local_78;
  string local_38;
  void *local_18;
  Variable *this_local;
  
  local_18 = this;
  this_local = (Variable *)__return_storage_ptr__;
  glu::declare(&local_78,(VarType *)((long)this + 0x28),(string *)((long)this + 8),0);
  de::toString<glu::decl::DeclareVariable>(&local_38,&local_78);
  std::operator+(__return_storage_ptr__,&local_38,";\n");
  std::__cxx11::string::~string((string *)&local_38);
  glu::decl::DeclareVariable::~DeclareVariable(&local_78);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::Variable::declare (void) const
{
	DE_ASSERT(!m_isArray);
	return de::toString(glu::declare(m_type, m_name)) + ";\n";
}